

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool __thiscall S2Loop::Decode(S2Loop *this,Decoder *decoder)

{
  uchar uVar1;
  size_t sVar2;
  uchar version;
  Decoder *decoder_local;
  S2Loop *this_local;
  
  sVar2 = Decoder::avail(decoder);
  if (sVar2 == 0) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = Decoder::get8(decoder);
    if (uVar1 == '\x01') {
      this_local._7_1_ = DecodeInternal(this,decoder,false);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool S2Loop::Decode(Decoder* const decoder) {
  if (decoder->avail() < sizeof(unsigned char)) return false;
  unsigned char version = decoder->get8();
  switch (version) {
    case kCurrentLosslessEncodingVersionNumber:
      return DecodeInternal(decoder, false);
  }
  return false;
}